

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O2

bool __thiscall
sptk::StatisticsAccumulation::GetUnbiasedCovariance
          (StatisticsAccumulation *this,Buffer *buffer,SymmetricMatrix *unbiased_covariance)

{
  int iVar1;
  bool bVar2;
  double *pdVar3;
  bool bVar4;
  int iVar5;
  int j;
  int column;
  int iVar6;
  Row local_48;
  
  bVar4 = false;
  if ((this->is_valid_ == true) && (1 < this->num_statistics_order_)) {
    if (this->diagonal_ == false) {
      bVar4 = false;
      if ((unbiased_covariance != (SymmetricMatrix *)0x0) &&
         (bVar4 = false, 1 < buffer->zeroth_order_statistics_)) {
        bVar2 = GetFullCovariance(this,buffer,unbiased_covariance);
        iVar5 = 0;
        bVar4 = false;
        if (bVar2) {
          iVar1 = buffer->zeroth_order_statistics_;
          iVar6 = 1;
          for (; iVar5 <= this->num_order_; iVar5 = iVar5 + 1) {
            for (column = 0; iVar6 != column; column = column + 1) {
              local_48._vptr_Row = (_func_int **)&PTR__Row_00114d30;
              local_48.matrix_ = unbiased_covariance;
              local_48.row_ = iVar5;
              pdVar3 = SymmetricMatrix::Row::operator[](&local_48,column);
              *pdVar3 = *pdVar3 * ((double)iVar1 / (double)(iVar1 + -1));
            }
            iVar6 = iVar6 + 1;
          }
          bVar4 = true;
        }
      }
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool StatisticsAccumulation::GetUnbiasedCovariance(
    const StatisticsAccumulation::Buffer& buffer,
    SymmetricMatrix* unbiased_covariance) const {
  if (!is_valid_ || num_statistics_order_ < 2 || diagonal_ ||
      buffer.zeroth_order_statistics_ <= 1 || NULL == unbiased_covariance) {
    return false;
  }

  if (!GetFullCovariance(buffer, unbiased_covariance)) {
    return false;
  }

  const double z(static_cast<double>(buffer.zeroth_order_statistics_) /
                 (buffer.zeroth_order_statistics_ - 1));
  for (int i(0); i <= num_order_; ++i) {
    for (int j(0); j <= i; ++j) {
      (*unbiased_covariance)[i][j] *= z;
    }
  }

  return true;
}